

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.hxx
# Opt level: O0

void saisxx_private::
     induceSA<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                T,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> SA,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> C,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> B,int n,int k)

{
  bool bVar1;
  uint uVar2;
  reference puVar3;
  reference piVar4;
  uint *puVar5;
  difference_type dVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *this;
  uint local_d8;
  uint local_cc;
  uint local_bc;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  int *local_80;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  int *local_70;
  int *local_68;
  int *local_60;
  int *local_58;
  int *local_50;
  uint local_48;
  uint local_44;
  char_type c1;
  char_type c0;
  int j;
  int i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> b;
  int k_local;
  int n_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> B_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> C_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> SA_local;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  T_local;
  
  b._M_current._0_4_ = k;
  b._M_current._4_4_ = n;
  _k_local = B._M_current;
  B_local = C;
  C_local = SA;
  SA_local._M_current = (int *)T._M_current;
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&j);
  bVar1 = __gnu_cxx::operator==
                    (&B_local,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              &k_local);
  if (bVar1) {
    local_50 = SA_local._M_current;
    local_58 = B_local._M_current;
    getCounts<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )SA_local._M_current,B_local,b._M_current._4_4_,(int)b._M_current);
  }
  local_60 = B_local._M_current;
  local_68 = _k_local;
  getBuckets<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (B_local,_k_local,(int)b._M_current,false);
  c1 = b._M_current._4_4_ - 1;
  puVar3 = __gnu_cxx::
           __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         *)&SA_local,(long)(int)c1);
  local_48 = *puVar3;
  piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator[]
                     ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&k_local,
                      (ulong)local_48);
  local_70 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+(&C_local,(long)*piVar4);
  _j = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_70;
  if (((int)c1 < 1) ||
     (puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)&SA_local,(long)(int)(c1 - 1)), local_48 <= *puVar3)) {
    local_bc = c1;
  }
  else {
    local_bc = c1 ^ 0xffffffff;
  }
  local_78 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator++((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&j,0);
  puVar5 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_78);
  *puVar5 = local_bc;
  for (c0 = 0; (int)c0 < b._M_current._4_4_; c0 = c0 + 1) {
    puVar5 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator[](&C_local,(long)(int)c0);
    c1 = *puVar5;
    uVar2 = c1 ^ 0xffffffff;
    puVar5 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator[](&C_local,(long)(int)c0);
    *puVar5 = uVar2;
    if (0 < (int)c1) {
      c1 = c1 - 1;
      puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)&SA_local,(long)(int)c1);
      local_44 = *puVar3;
      if (local_44 != local_48) {
        dVar6 = __gnu_cxx::operator-
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&j,
                           &C_local);
        piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator[]((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            &k_local,(ulong)local_48);
        *piVar4 = (int)dVar6;
        local_48 = local_44;
        piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator[]((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            &k_local,(ulong)local_44);
        local_80 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(&C_local,(long)*piVar4);
        _j = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_80;
      }
      if (((int)c1 < 1) ||
         (puVar3 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)&SA_local,(long)(int)(c1 - 1)), local_48 <= *puVar3)) {
        local_cc = c1;
      }
      else {
        local_cc = c1 ^ 0xffffffff;
      }
      local_88 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator++((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&j,
                            0);
      puVar5 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(&local_88);
      *puVar5 = local_cc;
    }
  }
  bVar1 = __gnu_cxx::operator==
                    (&B_local,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              &k_local);
  if (bVar1) {
    getCounts<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )SA_local._M_current,B_local,b._M_current._4_4_,(int)b._M_current);
  }
  getBuckets<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (B_local,_k_local,(int)b._M_current,true);
  c0 = b._M_current._4_4_ - 1;
  local_48 = 0;
  piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator[]
                     ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&k_local,
                      0);
  _j = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                 (&C_local,(long)*piVar4);
  for (; -1 < (int)c0; c0 = c0 - 1) {
    puVar5 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator[](&C_local,(long)(int)c0);
    c1 = *puVar5;
    if ((int)c1 < 1) {
      uVar2 = c1 ^ 0xffffffff;
      puVar5 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator[](&C_local,(long)(int)c0);
      *puVar5 = uVar2;
    }
    else {
      c1 = c1 - 1;
      puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)&SA_local,(long)(int)c1);
      local_44 = *puVar3;
      if (local_44 != local_48) {
        dVar6 = __gnu_cxx::operator-
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&j,
                           &C_local);
        piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator[]((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            &k_local,(ulong)local_48);
        *piVar4 = (int)dVar6;
        local_48 = local_44;
        piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator[]((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            &k_local,(ulong)local_44);
        _j = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                       (&C_local,(long)*piVar4);
      }
      if ((c1 == 0) ||
         (puVar3 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)&SA_local,(long)(int)(c1 - 1)), local_48 < *puVar3)) {
        local_d8 = c1 ^ 0xffffffff;
      }
      else {
        local_d8 = c1;
      }
      this = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator--((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&j);
      puVar5 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(this);
      *puVar5 = local_d8;
    }
  }
  return;
}

Assistant:

void
induceSA(string_type T, sarray_type SA, bucket_type C, bucket_type B,
         index_type n, index_type k) {
typedef typename std::iterator_traits<string_type>::value_type char_type;
  sarray_type b;
  index_type i, j;
  char_type c0, c1;
  /* compute SAl */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, false); /* find starts of buckets */
  b = SA + B[c1 = T[j = n - 1]];
  *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
  for(i = 0; i < n; ++i) {
    j = SA[i], SA[i] = ~j;
    if(0 < j) {
      if((c0 = T[--j]) != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
    }
  }
  /* compute SAs */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, true); /* find ends of buckets */
  for(i = n - 1, b = SA + B[c1 = 0]; 0 <= i; --i) {
    if(0 < (j = SA[i])) {
      if((c0 = T[--j]) != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *--b = ((j == 0) || (T[j - 1] > c1)) ? ~j : j;
    } else {
      SA[i] = ~j;
    }
  }
}